

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<only_assigned_on_reset::MainVisitor,_true,_true,_false,_false>::
visit<slang::ast::ContinuousAssignSymbol>
          (ASTVisitor<only_assigned_on_reset::MainVisitor,_true,_true,_false,_false> *this,
          ContinuousAssignSymbol *t)

{
  ASTVisitor<only_assigned_on_reset::MainVisitor,_true,_true,_false,_false> *in_RSI;
  ContinuousAssignSymbol *in_stack_ffffffffffffffe8;
  
  visitDefault<slang::ast::ContinuousAssignSymbol>(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }